

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.h
# Opt level: O2

int floatx80_le_quiet_m68k(floatx80 a,floatx80 b,float_status *status)

{
  ushort uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  bool bVar5;
  bool bVar6;
  
  uVar2 = b.low;
  uVar3 = a.low;
  uVar1 = a.high;
  if ((long)uVar3 < 0 || ((undefined1  [16])a & (undefined1  [16])0x7fff) == (undefined1  [16])0x0)
  {
    uVar4 = b.high;
    if (((undefined1  [16])b & (undefined1  [16])0x7fff) == (undefined1  [16])0x0 || (long)uVar2 < 0
       ) {
      if ((((undefined1  [16])a & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
           (uVar1 & 0x7fff) != 0x7fff) &&
         (((undefined1  [16])b & (undefined1  [16])0x7fffffffffffffff) == (undefined1  [16])0x0 ||
          (uVar4 & 0x7fff) != 0x7fff)) {
        if ((short)(uVar4 ^ uVar1) < 0) {
          if ((short)uVar1 < 0) {
            bVar5 = true;
          }
          else {
            bVar5 = (((b._8_4_ | a._8_4_) * 2 & 0xffff) == 0 && uVar3 == 0) && uVar2 == 0;
          }
        }
        else {
          if ((short)uVar1 < 0) {
            bVar5 = uVar4 < uVar1;
            bVar6 = uVar2 < uVar3;
          }
          else {
            bVar5 = uVar1 < uVar4;
            bVar6 = uVar3 < uVar2;
          }
          bVar5 = (bool)(((bVar6 || uVar3 == uVar2) && uVar1 == uVar4) | bVar5);
        }
        goto LAB_00650b68;
      }
      if ((((uVar1 & 0x7fff) != 0x7fff) ||
          ((((undefined1  [16])a & (undefined1  [16])0x3fffffffffffffff) == (undefined1  [16])0x0 ||
           (((undefined1  [16])a & (undefined1  [16])0x4000000000000000) != (undefined1  [16])0x0)))
          ) && ((bVar5 = false, (uVar4 & 0x7fff) != 0x7fff ||
                ((((undefined1  [16])b & (undefined1  [16])0x3fffffffffffffff) ==
                  (undefined1  [16])0x0 ||
                 (((undefined1  [16])b & (undefined1  [16])0x4000000000000000) !=
                  (undefined1  [16])0x0)))))) goto LAB_00650b68;
    }
  }
  status->float_exception_flags = status->float_exception_flags | 1;
  bVar5 = false;
LAB_00650b68:
  return (int)bVar5;
}

Assistant:

static inline bool floatx80_invalid_encoding(floatx80 a)
{
    return (a.low & (1ULL << 63)) == 0 && (a.high & 0x7FFF) != 0;
}